

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_disarm(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t n_unldoor;
  wchar_t n_chests;
  wchar_t n_traps;
  loc_conflict grid1;
  monster *mon;
  object *poStack_28;
  _Bool more;
  object *obj;
  wchar_t err;
  wchar_t dir;
  loc_conflict grid;
  command *cmd_local;
  
  mon._7_1_ = false;
  grid = (loc_conflict)cmd;
  obj._0_4_ = cmd_get_arg_direction(cmd,"direction",(int *)((long)&obj + 4));
  if (((wchar_t)obj != L'\0') || (obj._4_4_ == L'\0')) {
    wVar2 = count_feats((loc *)&n_chests,square_isdisarmabletrap,false);
    wVar3 = count_chests((loc_conflict *)&n_chests,CHEST_TRAPPED);
    wVar4 = count_feats((loc *)&n_chests,square_isunlockeddoor,false);
    if (wVar2 + wVar3 + wVar4 == 1) {
      obj._4_4_ = motion_dir(player->grid,(loc)_n_chests);
      cmd_set_arg_direction((command *)grid,"direction",obj._4_4_);
    }
    else {
      wVar2 = cmd_get_direction((command *)grid,"direction",(int *)((long)&obj + 4),L'\0' < wVar3);
      if (wVar2 != L'\0') {
        return;
      }
    }
  }
  _err = (loc_conflict)loc_sum(player->grid,ddgrid[obj._4_4_]);
  poStack_28 = chest_check(player,_err,CHEST_TRAPPED);
  if ((poStack_28 != (object *)0x0) || (_Var1 = do_cmd_disarm_test(player,_err), _Var1)) {
    player->upkeep->energy_use = (uint)z_info->move_energy;
    _Var1 = player_confuse_dir(player,(int *)((long)&obj + 4),false);
    if (_Var1) {
      _err = (loc_conflict)loc_sum(player->grid,ddgrid[obj._4_4_]);
      poStack_28 = chest_check(player,_err,CHEST_TRAPPED);
    }
    grid1 = (loc_conflict)square_monster((chunk *)cave,_err);
    if (grid1 == (loc_conflict)0x0) {
      if (poStack_28 == (object *)0x0) {
        _Var1 = square_iscloseddoor((chunk *)cave,_err);
        if ((!_Var1) || (_Var1 = square_islockeddoor((chunk *)cave,_err), _Var1)) {
          mon._7_1_ = do_cmd_disarm_aux(_err);
        }
        else {
          mon._7_1_ = do_cmd_lock_door(_err);
        }
      }
      else {
        mon._7_1_ = do_cmd_disarm_chest(poStack_28);
      }
    }
    else {
      _Var1 = monster_is_camouflaged((monster *)grid1);
      if (_Var1) {
        become_aware((chunk *)cave,(monster *)grid1);
        monster_wake((monster *)grid1,false,L'd');
      }
      else {
        msg("There is a monster in the way!");
        py_attack(player,_err);
      }
    }
    if (mon._7_1_ == false) {
      disturb(player);
    }
  }
  else {
    disturb(player);
  }
  return;
}

Assistant:

void do_cmd_disarm(struct command *cmd)
{
	struct loc grid;
	int dir;
	int err;

	struct object *obj;
	bool more = false;
	struct monster *mon;

	/* Get arguments */
	err = cmd_get_arg_direction(cmd, "direction", &dir);
	if (err || dir == DIR_UNKNOWN) {
		struct loc grid1;
		int n_traps, n_chests, n_unldoor;

		n_traps = count_feats(&grid1, square_isdisarmabletrap, false);
		n_chests = count_chests(&grid1, CHEST_TRAPPED);
		n_unldoor = count_feats(&grid1, square_isunlockeddoor, false);

		if (n_traps + n_chests + n_unldoor == 1) {
			dir = motion_dir(player->grid, grid1);
			cmd_set_arg_direction(cmd, "direction", dir);
		} else if (cmd_get_direction(cmd, "direction", &dir, n_chests > 0)) {
			/* If there are chests to disarm, 5 is allowed as a direction */
			return;
		}
	}

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Check for chests */
	obj = chest_check(player, grid, CHEST_TRAPPED);

	/* Verify legality */
	if (!obj && !do_cmd_disarm_test(player, grid)) {
		/* Cancel repeat */
		disturb(player);
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);

		/* Check for chests */
		obj = chest_check(player, grid, CHEST_TRAPPED);
	}


	/* Monster */
	mon = square_monster(cave, grid);
	if (mon) {
		if (monster_is_camouflaged(mon)) {
			become_aware(cave, mon);

			monster_wake(mon, false, 100);
		} else {
			msg("There is a monster in the way!");
			py_attack(player, grid);
		}
	} else if (obj)
		/* Chest */
		more = do_cmd_disarm_chest(obj);
	else if (square_iscloseddoor(cave, grid) &&
			 !square_islockeddoor(cave, grid))
		/* Door to lock */
		more = do_cmd_lock_door(grid);
	else
		/* Disarm trap */
		more = do_cmd_disarm_aux(grid);

	/* Cancel repeat unless told not to */
	if (!more) disturb(player);
}